

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,IReporterFactoryPtr *factory)

{
  long lVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_bool>
  pVar2;
  ReusableStringStream RStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  lVar1 = std::__cxx11::string::find((char *)name,0x166889);
  if (lVar1 != -1) {
    ReusableStringStream::ReusableStringStream(&RStack_88);
    std::operator+(&local_78,"\'::\' is not allowed in reporter name: \'",name);
    std::operator+(&local_58,&local_78,'\'');
    std::operator<<(RStack_88.m_oss,(string *)&local_58);
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_38);
  }
  pVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,Catch::Detail::unique_ptr<Catch::IReporterFactory>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>>
                      *)&((this->m_impl).m_ptr)->factories,name,factory);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&RStack_88);
  std::operator+(&local_78,"reporter using \'",name);
  std::operator+(&local_58,&local_78,"\' as name was already registered");
  std::operator<<(RStack_88.m_oss,(string *)&local_58);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_38);
}

Assistant:

void ReporterRegistry::registerReporter( std::string const& name,
                                             IReporterFactoryPtr factory ) {
        CATCH_ENFORCE( name.find( "::" ) == name.npos,
                       "'::' is not allowed in reporter name: '" + name +
                           '\'' );
        auto ret = m_impl->factories.emplace( name, CATCH_MOVE( factory ) );
        CATCH_ENFORCE( ret.second,
                       "reporter using '" + name +
                           "' as name was already registered" );
    }